

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

cmpResult __thiscall
llvm::detail::DoubleAPFloat::compareAbsoluteValue(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  APFloat *pAVar1;
  APFloat *pAVar2;
  cmpResult cVar3;
  cmpResult cVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  Storage *pSVar9;
  
  cVar3 = APFloat::compareAbsoluteValue
                    ((this->Floats)._M_t.
                     super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                     super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl,
                     (RHS->Floats)._M_t.
                     super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                     super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl);
  if (cVar3 != cmpEqual) {
    return cVar3;
  }
  cVar3 = APFloat::compareAbsoluteValue
                    ((this->Floats)._M_t.
                     super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                     super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,
                     (RHS->Floats)._M_t.
                     super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                     super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1);
  if ((cVar3 & ~cmpGreaterThan) != cmpLessThan) {
    return cVar3;
  }
  pAVar1 = (this->Floats)._M_t.
           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
           super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
  pAVar2 = (APFloat *)(pAVar1->U).IEEE.significand.part;
  if ((pAVar1->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
    pAVar2 = pAVar1;
  }
  pSVar9 = (Storage *)(pAVar1[1].U.IEEE.significand.part + 8);
  if (pAVar1[1].U.semantics != (fltSemantics *)semPPCDoubleDouble) {
    pSVar9 = &pAVar1[1].U;
  }
  bVar5 = (*(undefined1 *)((long)&pAVar2->U + 0x12) ^ *(byte *)((long)pSVar9 + 0x12)) & 8;
  pAVar1 = (RHS->Floats)._M_t.
           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
           super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
  pAVar2 = (APFloat *)(pAVar1->U).IEEE.significand.part;
  if ((pAVar1->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
    pAVar2 = pAVar1;
  }
  pSVar9 = (Storage *)(pAVar1[1].U.IEEE.significand.part + 8);
  if (pAVar1[1].U.semantics != (fltSemantics *)semPPCDoubleDouble) {
    pSVar9 = &pAVar1[1].U;
  }
  bVar7 = (*(undefined1 *)((long)&pAVar2->U + 0x12) ^ *(byte *)((long)pSVar9 + 0x12)) & 8;
  bVar8 = bVar5 >> 3 ^ 1;
  if (bVar7 == 0) {
    bVar6 = 0;
    cVar4 = cmpLessThan;
    if (bVar8 == 0) goto LAB_0014068d;
  }
  if ((bVar7 >> 3 & bVar8) == 0) {
    if ((bVar5 | bVar7) == 8) {
      bVar6 = (bVar5 & bVar7) >> 3 ^ 1;
      cVar4 = cmpGreaterThan - cVar3;
    }
    else {
      bVar6 = 0;
      cVar4 = cVar3;
    }
  }
  else {
    bVar6 = 0;
    cVar4 = cmpGreaterThan;
  }
LAB_0014068d:
  if (bVar6 != 0) {
    return cVar3;
  }
  return cVar4;
}

Assistant:

APFloat::cmpResult
DoubleAPFloat::compareAbsoluteValue(const DoubleAPFloat &RHS) const {
  auto Result = Floats[0].compareAbsoluteValue(RHS.Floats[0]);
  if (Result != cmpEqual)
    return Result;
  Result = Floats[1].compareAbsoluteValue(RHS.Floats[1]);
  if (Result == cmpLessThan || Result == cmpGreaterThan) {
    auto Against = Floats[0].isNegative() ^ Floats[1].isNegative();
    auto RHSAgainst = RHS.Floats[0].isNegative() ^ RHS.Floats[1].isNegative();
    if (Against && !RHSAgainst)
      return cmpLessThan;
    if (!Against && RHSAgainst)
      return cmpGreaterThan;
    if (!Against && !RHSAgainst)
      return Result;
    if (Against && RHSAgainst)
      return (cmpResult)(cmpLessThan + cmpGreaterThan - Result);
  }
  return Result;
}